

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::MinTypMaxExpression::fromSyntax
          (Compilation *compilation,MinTypMaxExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  MinTypMax MVar1;
  bool bVar2;
  CompilationOptions *pCVar3;
  Type *args;
  SyntaxNode *this;
  BumpAllocator *in_RDX;
  Compilation *in_RDI;
  MinTypMaxExpression *result;
  Expression *selected;
  Type *in_stack_000000a8;
  Expression *max;
  ExpressionSyntax *in_stack_000000b8;
  Expression *typ;
  bitmask<slang::ast::ASTFlags> in_stack_000000c8;
  Expression *min;
  ASTFlags maxFlags;
  ASTFlags typFlags;
  ASTFlags minFlags;
  Expression *expr;
  Compilation *in_stack_fffffffffffffef0;
  SourceLocation args_4;
  SourceLocation args_3;
  SourceLocation args_2;
  Compilation *args_1;
  SourceRange local_90;
  MinTypMaxExpression *local_80;
  SourceLocation local_78;
  bitmask<slang::ast::ASTFlags> local_70;
  SourceLocation local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  SourceLocation local_58;
  bitmask<slang::ast::ASTFlags> local_50;
  SourceLocation local_48;
  ASTFlags local_40;
  ASTFlags local_38;
  ASTFlags local_30;
  BumpAllocator *local_20;
  Compilation *local_10;
  MinTypMaxExpression *local_8;
  
  local_30 = UnevaluatedBranch;
  local_38 = UnevaluatedBranch;
  local_40 = UnevaluatedBranch;
  local_20 = in_RDX;
  local_10 = in_RDI;
  pCVar3 = Compilation::getOptions(in_RDI);
  MVar1 = pCVar3->minTypMax;
  if (MVar1 == Min) {
    local_30 = None;
  }
  else if (MVar1 == Typ) {
    local_38 = None;
  }
  else if (MVar1 == Max) {
    local_40 = None;
  }
  args_1 = local_10;
  args = (Type *)not_null<slang::syntax::ExpressionSyntax_*>::operator*
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0x99e5ca);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_50,local_30);
  local_48 = (SourceLocation)
             Expression::create((Compilation *)typ,in_stack_000000b8,(ASTContext *)max,
                                in_stack_000000c8,in_stack_000000a8);
  this = &not_null<slang::syntax::ExpressionSyntax_*>::operator*
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0x99e63b)->super_SyntaxNode;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_60,local_38);
  local_58 = (SourceLocation)
             Expression::create((Compilation *)typ,in_stack_000000b8,(ASTContext *)max,
                                in_stack_000000c8,in_stack_000000a8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x99e6ac);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_70,local_40);
  local_68 = (SourceLocation)
             Expression::create((Compilation *)typ,in_stack_000000b8,(ASTContext *)max,
                                in_stack_000000c8,in_stack_000000a8);
  local_78 = (SourceLocation)0x0;
  pCVar3 = Compilation::getOptions(local_10);
  MVar1 = pCVar3->minTypMax;
  if (MVar1 == Min) {
    local_78 = local_48;
  }
  else if (MVar1 == Typ) {
    local_78 = local_58;
  }
  else if (MVar1 == Max) {
    local_78 = local_68;
  }
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x99e796);
  args_4 = local_58;
  args_3 = local_68;
  args_2 = local_48;
  local_90 = slang::syntax::SyntaxNode::sourceRange(this);
  expr = (Expression *)&local_90;
  local_80 = BumpAllocator::
             emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
                       (local_20,args,(Expression *)args_1,(Expression *)args_2,(Expression *)args_3
                        ,(Expression **)args_4,(SourceRange *)this);
  bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffef0);
  if (((bVar2) || (bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffef0), bVar2)) ||
     (bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffef0), bVar2)) {
    local_8 = (MinTypMaxExpression *)Expression::badExpr(in_stack_fffffffffffffef0,expr);
  }
  else {
    local_8 = local_80;
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& MinTypMaxExpression::fromSyntax(Compilation& compilation,
                                            const MinTypMaxExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* assignmentTarget) {
    // Only one of the expressions will be considered evaluated.
    auto minFlags = ASTFlags::UnevaluatedBranch;
    auto typFlags = ASTFlags::UnevaluatedBranch;
    auto maxFlags = ASTFlags::UnevaluatedBranch;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            minFlags = ASTFlags::None;
            break;
        case MinTypMax::Typ:
            typFlags = ASTFlags::None;
            break;
        case MinTypMax::Max:
            maxFlags = ASTFlags::None;
            break;
    }

    auto& min = create(compilation, *syntax.min, context, minFlags, assignmentTarget);
    auto& typ = create(compilation, *syntax.typ, context, typFlags, assignmentTarget);
    auto& max = create(compilation, *syntax.max, context, maxFlags, assignmentTarget);

    Expression* selected = nullptr;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            selected = &min;
            break;
        case MinTypMax::Typ:
            selected = &typ;
            break;
        case MinTypMax::Max:
            selected = &max;
            break;
    }

    auto result = compilation.emplace<MinTypMaxExpression>(*selected->type, min, typ, max, selected,
                                                           syntax.sourceRange());
    if (min.bad() || typ.bad() || max.bad())
        return badExpr(compilation, result);

    return *result;
}